

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::_::concat<kj::String,kj::StringPtr&,kj::StringPtr>
          (String *__return_storage_ptr__,_ *this,String *params,StringPtr *params_1,
          StringPtr *params_2)

{
  long lVar1;
  char *target;
  
  lVar1 = 0;
  if (*(long *)(this + 8) != 0) {
    lVar1 = *(long *)(this + 8) + -1;
  }
  heapString(__return_storage_ptr__,
             (lVar1 + (params->content).size_ + (params_1->content).size_) - 2);
  target = (char *)(__return_storage_ptr__->content).size_;
  if (target != (char *)0x0) {
    target = (__return_storage_ptr__->content).ptr;
  }
  fill<kj::String,kj::StringPtr&,kj::StringPtr>(target,(String *)this,(StringPtr *)params,params_1);
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}